

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
::init(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
       *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  int iVar2;
  undefined4 extraout_var;
  char *pcVar4;
  int numBytes;
  int numBytes_00;
  string sStack_1d8;
  string local_1b8;
  undefined1 local_198 [384];
  long lVar3;
  
  iVar2 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
  ::init(&this->
          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
         ,ctx);
  local_198._0_8_ = local_198._0_8_ & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_zeroData,
             (long)(this->
                   super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                   ).m_bufferSizeMax,local_198);
  local_198._0_8_ =
       ((this->
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
        ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Testing performance with ");
  std::ostream::operator<<(poVar1,0x14);
  std::operator<<((ostream *)poVar1,
                  " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
                 );
  std::operator<<((ostream *)poVar1,"Buffer sizes are in range [");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_1b8,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                          ).m_bufferSizeMin,numBytes);
  std::operator<<((ostream *)poVar1,(string *)&local_1b8);
  std::operator<<((ostream *)poVar1,", ");
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&sStack_1d8,
             (_anonymous_namespace_ *)
             (ulong)(uint)(this->
                          super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                          ).m_bufferSizeMax,numBytes_00);
  std::operator<<((ostream *)poVar1,(string *)&sStack_1d8);
  std::operator<<((ostream *)poVar1,"].");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&sStack_1d8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  local_198._0_8_ =
       ((this->
        super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
        ).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Test result is the median transfer rate of the test samples.\n"
                 );
  std::operator<<((ostream *)poVar1,"Buffer usage = ");
  pcVar4 = glu::getUsageName(this->m_bufferUsage);
  std::operator<<((ostream *)poVar1,pcVar4);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  (**(code **)(lVar3 + 0x1680))
            ((((this->
               super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
               ).m_dummyProgram)->m_program).m_program);
  (**(code **)(lVar3 + 0x1a00))(0,0,0x20);
  iVar2 = (**(code **)(lVar3 + 0x610))
                    ((this->
                     super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
                     ).m_dummyProgramPosLoc);
  return iVar2;
}

Assistant:

void ModifyAfterBasicCase<SampleType>::init (void)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	// init parent

	BasicBufferCase<SampleType>::init();

	// upload source
	m_zeroData.resize(m_bufferSizeMax, 0x00);

	// log basic info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing performance with " << (int)NUM_SAMPLES << " test samples. Sample order is randomized. All samples at even positions (first = 0) are tested before samples at odd positions.\n"
		<< "Buffer sizes are in range [" << getHumanReadableByteSize(m_bufferSizeMin) << ", " << getHumanReadableByteSize(m_bufferSizeMax) << "]."
		<< tcu::TestLog::EndMessage;

	// log which transfer rate is the test result and buffer info

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Test result is the median transfer rate of the test samples.\n"
		<< "Buffer usage = " << glu::getUsageName(m_bufferUsage)
		<< tcu::TestLog::EndMessage;

	// Set state for drawing so that we don't have to change these during the iteration
	{
		gl.useProgram(m_dummyProgram->getProgram());
		gl.viewport(0, 0, DUMMY_RENDER_AREA_SIZE, DUMMY_RENDER_AREA_SIZE);
		gl.enableVertexAttribArray(m_dummyProgramPosLoc);
	}
}